

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL3_glfw::GLTextureBuffer::resize
          (GLTextureBuffer *this,uint newX,uint newY)

{
  int iVar1;
  PFNGLBINDTEXTUREPROC p_Var2;
  GLenum GVar3;
  runtime_error *this_00;
  ulong uVar4;
  
  TextureBuffer::resize(&this->super_TextureBuffer,newX,newY);
  p_Var2 = glad_glBindTexture;
  GVar3 = textureType(this);
  (*p_Var2)(GVar3,this->handle);
  checkGLError(true);
  iVar1 = (this->super_TextureBuffer).dim;
  if (iVar1 == 2) {
    uVar4 = (ulong)(this->super_TextureBuffer).format;
    if (uVar4 < 10) {
      (*glad_glTexImage2D)
                (0xde1,0,*(GLint *)(&DAT_00415b68 + uVar4 * 4),(this->super_TextureBuffer).sizeX,
                 (this->super_TextureBuffer).sizeY,0,*(GLenum *)(&DAT_00415bb8 + uVar4 * 4),
                 *(GLenum *)(&DAT_00415b90 + uVar4 * 4),(void *)0x0);
      goto LAB_0020544f;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"bad enum");
  }
  else {
    if (iVar1 != 1) {
LAB_0020544f:
      checkGLError(true);
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"OpenGL error: called 2D resize on 1D texture");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void GLTextureBuffer::resize(unsigned int newX, unsigned int newY) {

  TextureBuffer::resize(newX, newY);

  bind();
  if (dim == 1) {
    throw std::runtime_error("OpenGL error: called 2D resize on 1D texture");
  }
  if (dim == 2) {
    glTexImage2D(GL_TEXTURE_2D, 0, internalFormat(format), sizeX, sizeY, 0, formatF(format), type(format), nullptr);
  }
  checkGLError();
}